

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopm.c
# Opt level: O0

void OPM_Mixer(opm_t *chip)

{
  uint32_t channel;
  uint32_t slot;
  opm_t *chip_local;
  
  chip->mix_serial[1] = chip->mix_serial[1] >> 1;
  if (chip->cycles == 0xd) {
    chip->mix_serial[1] = (chip->mix[1] & 0x3ffU) << 4 | chip->mix_serial[1];
  }
  if (chip->cycles == 0xe) {
    chip->mix_serial[1] = chip->mix_serial[1] | (chip->mix2[1] & 0x7c00U) << 3;
    chip->mix_serial[1] = chip->mix_serial[1] | (uint)((chip->mix2[1] & 0x20000U) == 0) << 0x12;
    chip->mix_clamp_low[1] = '\0';
    chip->mix_clamp_high[1] = '\0';
    switch((uint)chip->mix2[1] >> 0xf & 7) {
    case 0:
      break;
    case 1:
      chip->mix_clamp_high[1] = '\x01';
      break;
    case 2:
      chip->mix_clamp_high[1] = '\x01';
      break;
    case 3:
      chip->mix_clamp_high[1] = '\x01';
      break;
    case 4:
      chip->mix_clamp_low[1] = '\x01';
      break;
    case 5:
      chip->mix_clamp_low[1] = '\x01';
      break;
    case 6:
      chip->mix_clamp_low[1] = '\x01';
      break;
    case 7:
    }
  }
  if (chip->mix_clamp_low[1] != '\0') {
    chip->mix_serial[1] = chip->mix_serial[1] & 0xfffffffd;
  }
  if (chip->mix_clamp_high[1] != '\0') {
    chip->mix_serial[1] = chip->mix_serial[1] | 2;
  }
  chip->mix_serial[0] = chip->mix_serial[0] >> 1;
  if (chip->cycles == 0x1d) {
    chip->mix_serial[0] = (chip->mix[0] & 0x3ffU) << 4 | chip->mix_serial[0];
  }
  if (chip->cycles == 0x1e) {
    chip->mix_serial[0] = chip->mix_serial[0] | (chip->mix2[0] & 0x7c00U) << 3;
    chip->mix_serial[0] = chip->mix_serial[0] | (uint)((chip->mix2[0] & 0x20000U) == 0) << 0x12;
    chip->mix_clamp_low[0] = '\0';
    chip->mix_clamp_high[0] = '\0';
    switch((uint)chip->mix2[0] >> 0xf & 7) {
    case 0:
      break;
    case 1:
      chip->mix_clamp_high[0] = '\x01';
      break;
    case 2:
      chip->mix_clamp_high[0] = '\x01';
      break;
    case 3:
      chip->mix_clamp_high[0] = '\x01';
      break;
    case 4:
      chip->mix_clamp_low[0] = '\x01';
      break;
    case 5:
      chip->mix_clamp_low[0] = '\x01';
      break;
    case 6:
      chip->mix_clamp_low[0] = '\x01';
      break;
    case 7:
    }
  }
  if (chip->mix_clamp_low[0] != '\0') {
    chip->mix_serial[0] = chip->mix_serial[0] & 0xfffffffd;
  }
  if (chip->mix_clamp_high[0] != '\0') {
    chip->mix_serial[0] = chip->mix_serial[0] | 2;
  }
  chip->mix2[0] = chip->mix[0];
  chip->mix2[1] = chip->mix[1];
  if (chip->cycles == 0xd) {
    chip->mix[1] = 0;
  }
  if (chip->cycles == 0x1d) {
    chip->mix[0] = 0;
  }
  chip->mix[0] = (int)chip->op_mix * (uint)chip->op_mixl + chip->mix[0];
  chip->mix[1] = (int)chip->op_mix * (uint)chip->op_mixr + chip->mix[1];
  return;
}

Assistant:

static void OPM_Mixer(opm_t *chip)
{
    uint32_t slot = (chip->cycles + 18) % 32;
    uint32_t channel = (slot % 8);
    // Right channel
    chip->mix_serial[1] >>= 1;
    if (chip->cycles == 13)
    {
        chip->mix_serial[1] |= (chip->mix[1] & 1023) << 4;
    }
    if (chip->cycles == 14)
    {
        chip->mix_serial[1] |= ((chip->mix2[1] >> 10) & 31) << 13;
        chip->mix_serial[1] |= (((chip->mix2[1] >> 17) & 1) ^ 1) << 18;
        chip->mix_clamp_low[1] = 0;
        chip->mix_clamp_high[1] = 0;
        switch ((chip->mix2[1]>>15) & 7)
        {
        case 0:
        default:
            break;
        case 1:
            chip->mix_clamp_high[1] = 1;
            break;
        case 2:
            chip->mix_clamp_high[1] = 1;
            break;
        case 3:
            chip->mix_clamp_high[1] = 1;
            break;
        case 4:
            chip->mix_clamp_low[1] = 1;
            break;
        case 5:
            chip->mix_clamp_low[1] = 1;
            break;
        case 6:
            chip->mix_clamp_low[1] = 1;
            break;
        case 7:
            break;
        }
    }
    if (chip->mix_clamp_low[1])
    {
        chip->mix_serial[1] &= ~2;
    }
    if (chip->mix_clamp_high[1])
    {
        chip->mix_serial[1] |= 2;
    }
    // Left channel
    chip->mix_serial[0] >>= 1;
    if (chip->cycles == 29)
    {
        chip->mix_serial[0] |= (chip->mix[0] & 1023) << 4;
    }
    if (chip->cycles == 30)
    {
        chip->mix_serial[0] |= ((chip->mix2[0] >> 10) & 31) << 13;
        chip->mix_serial[0] |= (((chip->mix2[0] >> 17) & 1) ^ 1) << 18;
        chip->mix_clamp_low[0] = 0;
        chip->mix_clamp_high[0] = 0;
        switch ((chip->mix2[0]>>15) & 7)
        {
        case 0:
        default:
            break;
        case 1:
            chip->mix_clamp_high[0] = 1;
            break;
        case 2:
            chip->mix_clamp_high[0] = 1;
            break;
        case 3:
            chip->mix_clamp_high[0] = 1;
            break;
        case 4:
            chip->mix_clamp_low[0] = 1;
            break;
        case 5:
            chip->mix_clamp_low[0] = 1;
            break;
        case 6:
            chip->mix_clamp_low[0] = 1;
            break;
        case 7:
            break;
        }
    }
    if (chip->mix_clamp_low[0])
    {
        chip->mix_serial[0] &= ~2;
    }
    if (chip->mix_clamp_high[0])
    {
        chip->mix_serial[0] |= 2;
    }
    chip->mix2[0] = chip->mix[0];
    chip->mix2[1] = chip->mix[1];
    if (chip->cycles == 13)
    {
        chip->mix[1] = 0;
    }
    if (chip->cycles == 29)
    {
        chip->mix[0] = 0;
    }
    chip->mix[0] += chip->op_mix * chip->op_mixl;
    chip->mix[1] += chip->op_mix * chip->op_mixr;
}